

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

Machine * runInst(Machine *__return_storage_ptr__,Machine *m,Inst *i)

{
  Register RVar1;
  pointer pAVar2;
  Functor *pFVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  *this;
  Machine *m_00;
  Machine local_320;
  Machine local_2b0;
  Machine local_240;
  Machine local_1d0;
  Machine local_160;
  Machine local_f0;
  Functor local_80;
  Functor local_58;
  
  switch(i->tag_) {
  case PutStructure:
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)&local_320,
               (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)m);
    this = &local_320.regval;
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::_Rb_tree(&this->_M_t,&(m->regval)._M_t);
    local_320.mode = m->mode;
    local_320.h.hix = (m->h).hix;
    local_320.s.hix = (m->s).hix;
    pAVar2 = (i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if (pAVar2->tag != Register) {
LAB_00104a69:
      __assert_fail("tag == ArgTag::Register",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                    ,0x219,"Register Arg::r()");
    }
    RVar1.r = (pAVar2->r_).r;
    Arg::f(&local_80,pAVar2 + 1);
    m_00 = &local_320;
    putStructure(__return_storage_ptr__,m_00,RVar1,&local_80);
    pFVar3 = &local_80;
    goto LAB_00104970;
  case SetVariable:
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)&local_240,
               (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)m);
    this = &local_240.regval;
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::_Rb_tree(&this->_M_t,&(m->regval)._M_t);
    local_240.mode = m->mode;
    local_240.h.hix = (m->h).hix;
    local_240.s.hix = (m->s).hix;
    pAVar2 = (i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if (pAVar2->tag != Register) goto LAB_00104a69;
    m_00 = &local_240;
    setVariable(__return_storage_ptr__,m_00,(Register)(pAVar2->r_).r);
    break;
  case SetValue:
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)&local_1d0,
               (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)m);
    this = &local_1d0.regval;
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::_Rb_tree(&this->_M_t,&(m->regval)._M_t);
    local_1d0.mode = m->mode;
    local_1d0.h.hix = (m->h).hix;
    local_1d0.s.hix = (m->s).hix;
    pAVar2 = (i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if (pAVar2->tag != Register) goto LAB_00104a69;
    m_00 = &local_1d0;
    setValue(__return_storage_ptr__,m_00,(Register)(pAVar2->r_).r);
    break;
  case GetStructure:
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)&local_2b0,
               (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)m);
    this = &local_2b0.regval;
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::_Rb_tree(&this->_M_t,&(m->regval)._M_t);
    local_2b0.mode = m->mode;
    local_2b0.h.hix = (m->h).hix;
    local_2b0.s.hix = (m->s).hix;
    pAVar2 = (i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if (pAVar2->tag != Register) goto LAB_00104a69;
    RVar1.r = (pAVar2->r_).r;
    Arg::f(&local_58,pAVar2 + 1);
    m_00 = &local_2b0;
    getStructure(__return_storage_ptr__,m_00,RVar1,&local_58);
    pFVar3 = &local_58;
LAB_00104970:
    paVar4 = &(pFVar3->id).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar4->_M_allocated_capacity)[-2] != paVar4) {
      operator_delete((undefined1 *)(&paVar4->_M_allocated_capacity)[-2],
                      paVar4->_M_allocated_capacity + 1);
    }
    break;
  case UnifyVariable:
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)&local_160,
               (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)m);
    this = &local_160.regval;
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::_Rb_tree(&this->_M_t,&(m->regval)._M_t);
    local_160.mode = m->mode;
    local_160.h.hix = (m->h).hix;
    local_160.s.hix = (m->s).hix;
    pAVar2 = (i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if (pAVar2->tag != Register) goto LAB_00104a69;
    m_00 = &local_160;
    unifyVariable(__return_storage_ptr__,m_00,(Register)(pAVar2->r_).r);
    break;
  case UnifyValue:
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)&local_f0,
               (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)m);
    this = &local_f0.regval;
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::_Rb_tree(&this->_M_t,&(m->regval)._M_t);
    local_f0.mode = m->mode;
    local_f0.h.hix = (m->h).hix;
    local_f0.s.hix = (m->s).hix;
    pAVar2 = (i->args).super__Vector_base<Arg,_std::allocator<Arg>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if (pAVar2->tag != Register) goto LAB_00104a69;
    m_00 = &local_f0;
    unifyValue(__return_storage_ptr__,m_00,(Register)(pAVar2->r_).r);
    break;
  default:
    __assert_fail("false && \"unreachable\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                  ,0x288,"Machine runInst(Machine, Inst)");
  }
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::~_Rb_tree(&this->_M_t);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
               *)m_00);
  return __return_storage_ptr__;
}

Assistant:

Machine runInst(Machine m, Inst i) {
    switch (i.tag()) {
        case PutStructure: return putStructure(m, i.get<Register>(0), i.get<Functor>(1));
        case SetVariable: return setVariable(m, i.get<Register>(0));
        case SetValue: return setValue(m, i.get<Register>(0));
        case GetStructure: return getStructure(m, i.get<Register>(0), i.get<Functor>(1));
        case UnifyVariable: return unifyVariable(m, i.get<Register>(0));
        case UnifyValue: return unifyValue(m, i.get<Register>(0));
    }
    assert(false && "unreachable");
}